

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O1

size_t __thiscall serial::Serial::readline(Serial *this,string *buffer,size_t size,string *eol)

{
  size_type sVar1;
  SerialImpl *pSVar2;
  pointer __s2;
  long lVar3;
  undefined1 *puVar4;
  size_t __n;
  int iVar5;
  ssize_t sVar6;
  string *psVar7;
  undefined1 *puVar8;
  size_t sVar9;
  bool bVar10;
  undefined8 uStack_80;
  undefined1 auStack_78 [8];
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  Serial *local_50;
  size_t local_48;
  string *local_40;
  SerialImpl *local_38;
  
  local_38 = this->pimpl_;
  uStack_80 = 0x10c6f4;
  psVar7 = eol;
  local_50 = this;
  local_40 = buffer;
  SerialImpl::readLock(local_38);
  sVar9 = 0;
  sVar1 = eol->_M_string_length;
  lVar3 = -(size + 0xf & 0xfffffffffffffff0);
  puVar8 = auStack_78 + lVar3;
  local_48 = size;
  do {
    pSVar2 = local_50->pimpl_;
    *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x10c72a;
    sVar6 = SerialImpl::read(pSVar2,(int)puVar8 + (int)sVar9,(void *)0x1,(size_t)psVar7);
    sVar9 = sVar9 + sVar6;
    if (sVar6 == 0) break;
    local_70 = local_60;
    *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x10c74b;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,puVar8 + (sVar9 - sVar1));
    __n = local_68;
    puVar4 = local_70;
    bVar10 = true;
    if (local_68 == eol->_M_string_length) {
      if (local_68 == 0) {
        bVar10 = false;
      }
      else {
        __s2 = (eol->_M_dataplus)._M_p;
        *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x10c76b;
        iVar5 = bcmp(puVar4,__s2,__n);
        bVar10 = iVar5 != 0;
      }
    }
    puVar4 = local_70;
    if (local_70 != local_60) {
      *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x10c788;
      operator_delete(puVar4);
    }
  } while ((bool)(bVar10 & sVar9 != local_48));
  psVar7 = local_40;
  *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x10c7a3;
  std::__cxx11::string::append((char *)psVar7,(ulong)puVar8);
  pSVar2 = local_38;
  *(undefined8 *)(auStack_78 + lVar3 + -8) = 0x10c7ac;
  SerialImpl::readUnlock(pSVar2);
  return sVar9;
}

Assistant:

size_t
Serial::readline (string &buffer, size_t size, string eol)
{
  ScopedReadLock lock(this->pimpl_);
  size_t eol_len = eol.length ();
  uint8_t *buffer_ = static_cast<uint8_t*>
                              (alloca (size * sizeof (uint8_t)));
  size_t read_so_far = 0;
  while (true)
  {
    size_t bytes_read = this->read_ (buffer_ + read_so_far, 1);
    read_so_far += bytes_read;
    if (bytes_read == 0) {
      break; // Timeout occured on reading 1 byte
    }
    if (string (reinterpret_cast<const char*>
         (buffer_ + read_so_far - eol_len), eol_len) == eol) {
      break; // EOL found
    }
    if (read_so_far == size) {
      break; // Reached the maximum read length
    }
  }
  buffer.append(reinterpret_cast<const char*> (buffer_), read_so_far);
  return read_so_far;
}